

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t la_verify_filetype(mode_t mode,mode_t filetype)

{
  undefined4 local_14;
  wchar_t ret;
  mode_t filetype_local;
  mode_t mode_local;
  
  local_14 = L'\0';
  if (filetype == 0x1000) {
    local_14 = (wchar_t)((mode & 0xf000) == 0x1000);
  }
  else if (filetype == 0x2000) {
    local_14 = (wchar_t)((mode & 0xf000) == 0x2000);
  }
  else if (filetype == 0x4000) {
    local_14 = (wchar_t)((mode & 0xf000) == 0x4000);
  }
  else if (filetype == 0x6000) {
    local_14 = (wchar_t)((mode & 0xf000) == 0x6000);
  }
  else if (filetype == 0x8000) {
    local_14 = (wchar_t)((mode & 0xf000) == 0x8000);
  }
  else if (filetype == 0xa000) {
    local_14 = (wchar_t)((mode & 0xf000) == 0xa000);
  }
  else if (filetype == 0xc000) {
    local_14 = (wchar_t)((mode & 0xf000) == 0xc000);
  }
  return local_14;
}

Assistant:

static int
la_verify_filetype(mode_t mode, __LA_MODE_T filetype) {
	int ret = 0;

	switch (filetype) {
	case AE_IFREG:
		ret = (S_ISREG(mode));
		break;
	case AE_IFDIR:
		ret = (S_ISDIR(mode));
		break;
	case AE_IFLNK:
		ret = (S_ISLNK(mode));
		break;
	case AE_IFSOCK:
		ret = (S_ISSOCK(mode));
		break;
	case AE_IFCHR:
		ret = (S_ISCHR(mode));
		break;
	case AE_IFBLK:
		ret = (S_ISBLK(mode));
		break;
	case AE_IFIFO:
		ret = (S_ISFIFO(mode));
		break;
	default:
		break;
	}

	return (ret);
}